

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatbase.c
# Opt level: O2

int ecx_APRD(ecx_portt *port,uint16 ADP,uint16 ADO,uint16 length,void *data,int timeout)

{
  uint uVar1;
  int iVar2;
  uint idx;
  
  uVar1 = ecx_getindex(port);
  idx = uVar1 & 0xff;
  ecx_setupdatagram(port,port->txbuf + idx,'\x01',(uint8)uVar1,ADP,ADO,length,data);
  iVar2 = ecx_srconfirm(port,idx,timeout);
  if (0 < iVar2) {
    memcpy(data,port->rxbuf[idx] + 0xc,(ulong)length);
  }
  ecx_setbufstat(port,idx,0);
  return iVar2;
}

Assistant:

int ecx_APRD(ecx_portt *port, uint16 ADP, uint16 ADO, uint16 length, void *data, int timeout)
{
   int wkc;
   uint8 idx;

   idx = ecx_getindex(port);
   ecx_setupdatagram(port, &(port->txbuf[idx]), EC_CMD_APRD, idx, ADP, ADO, length, data);
   wkc = ecx_srconfirm(port, idx, timeout);
   if (wkc > 0)
   {
      memcpy(data, &(port->rxbuf[idx][EC_HEADERSIZE]), length);
   }
   ecx_setbufstat(port, idx, EC_BUF_EMPTY);

   return wkc;
}